

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

void chaiscript::bootstrap::standard_library::detail::insert_at<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *container,int pos
               ,value_type *v)

{
  range_error *this;
  
  if ((-1 < pos) && ((long)(ulong)(uint)pos <= (long)container->_M_string_length)) {
    Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    insert(container,(__const_iterator)((container->_M_dataplus)._M_p + (uint)pos),*v);
    return;
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Cannot insert past end of range");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void insert_at(Type &container, int pos, const typename Type::value_type &v) {
      auto itr = container.begin();
      auto end = container.end();

      if (pos < 0 || std::distance(itr, end) < pos) {
        throw std::range_error("Cannot insert past end of range");
      }

      std::advance(itr, pos);
      container.insert(itr, v);
    }